

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O3

void ggml_backend_sched_split_graph(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  int iVar1;
  ggml_tensor *pgVar2;
  ggml_backend_dev_t pgVar3;
  int *piVar4;
  ggml_tensor *pgVar5;
  ggml_init_params params;
  _Bool _Var6;
  int iVar7;
  int iVar8;
  ggml_context *pgVar9;
  size_t sVar10;
  size_t sVar11;
  int *piVar12;
  ggml_backend_sched_split *pgVar13;
  ggml_backend_sched_split *pgVar14;
  ggml_tensor **ppgVar15;
  ggml_tensor *pgVar16;
  sbyte sVar17;
  int iVar18;
  char *pcVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  char *pcVar23;
  ggml_backend_sched_split **ppgVar24;
  int c;
  ggml_cgraph *pgVar25;
  int iVar26;
  long lVar27;
  ggml_cgraph *pgVar28;
  int n_supported;
  ulong uVar29;
  ggml_hash_set *pgVar30;
  int j_3;
  long lVar31;
  ulong uVar32;
  ggml_backend_t pgVar33;
  int j;
  long lVar34;
  byte bVar35;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar36;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 uVar39;
  int *piVar37;
  ggml_hash_set *pgVar38;
  undefined8 in_stack_ffffffffffffff18;
  ggml_cgraph *pgVar40;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  long local_c8;
  ggml_cgraph local_80;
  
  bVar35 = 0;
  sched->n_splits = 0;
  sched->n_graph_inputs = 0;
  sched->is_reset = false;
  ggml_free(sched->ctx);
  params.mem_size._4_4_ = in_stack_ffffffffffffff14;
  params.mem_size._0_4_ = in_stack_ffffffffffffff10;
  params.mem_buffer = (void *)in_stack_ffffffffffffff18;
  params._16_4_ = in_stack_ffffffffffffff20;
  params._20_4_ = in_stack_ffffffffffffff24;
  pgVar9 = ggml_init(params);
  sched->ctx = pgVar9;
  if (pgVar9 == (ggml_context *)0x0) {
    pcVar23 = "%s: failed to initialize context\n";
    pcVar19 = "ggml_backend_sched_split_graph";
    iVar7 = 0x36f;
    goto LAB_00127800;
  }
  if (0 < graph->n_leafs) {
    lVar31 = 0;
    do {
      pgVar2 = graph->leafs[lVar31];
      piVar37 = sched->hv_tensor_backend_ids;
      sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
      if (piVar37[sVar10] == -1) {
        iVar7 = ggml_backend_sched_backend_id_from_cur(sched,pgVar2);
        piVar37[sVar10] = iVar7;
      }
      lVar31 = lVar31 + 1;
    } while (lVar31 < graph->n_leafs);
  }
  uVar32 = (ulong)(uint)graph->n_nodes;
  pgVar25 = graph;
  if (graph->n_nodes < 1) {
LAB_001269aa:
    pgVar14 = sched->splits;
LAB_001269b8:
    uVar29 = 0;
LAB_001269bb:
    pgVar14->i_start = 0;
    pgVar14->n_inputs = 0;
    uVar22 = 1;
    uVar21 = (uint)uVar32;
    if ((int)uVar29 < (int)uVar21) {
      iVar7 = pgVar14->backend_id;
      pgVar30 = &sched->hash_set;
      uVar29 = uVar29 & 0xffffffff;
      iVar8 = 0;
      do {
        pgVar2 = pgVar25->nodes[uVar29];
        if (3 < pgVar2->op - GGML_OP_RESHAPE) {
          piVar37 = sched->hv_tensor_backend_ids;
          sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar2);
          iVar18 = piVar37[sVar10];
          if (iVar18 == iVar7) {
            if (0 < pgVar14->n_inputs) {
              lVar31 = 0;
              do {
                pgVar5 = pgVar2->src[lVar31];
                if (pgVar5 != (ggml_tensor *)0x0) {
                  if ((((pgVar5->buffer != (ggml_backend_buffer *)0x0) &&
                       (pgVar5->buffer->usage == GGML_BACKEND_BUFFER_USAGE_WEIGHTS)) &&
                      (piVar37 = sched->hv_tensor_backend_ids,
                      sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar5), piVar37[sVar10] != iVar7))
                     && (_Var6 = ggml_backend_sched_buffer_supported(sched,pgVar5,iVar7), !_Var6))
                  goto LAB_00126b29;
                  if (pgVar14->n_inputs == 10) {
                    sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar5);
                    iVar26 = sched->hv_tensor_backend_ids[sVar10];
                    _Var6 = ggml_backend_sched_buffer_supported(sched,pgVar5,iVar7);
                    if ((iVar26 != iVar7) &&
                       ((~_Var6 & sched->hv_tensor_copies
                                  [sVar10 * (long)sched->n_backends * (long)sched->n_copies +
                                   (long)iVar7 * (long)sched->n_copies] == (ggml_tensor *)0x0) != 0)
                       ) goto LAB_00126b29;
                  }
                }
                lVar31 = lVar31 + 1;
              } while (lVar31 != 10);
            }
          }
          else {
LAB_00126b29:
            iVar7 = iVar18;
            pgVar14->i_end = (int)uVar29;
            iVar8 = iVar8 + 1;
            iVar18 = sched->splits_capacity;
            pgVar13 = sched->splits;
            if (iVar18 <= iVar8) {
              sched->splits_capacity = iVar18 * 2;
              pgVar13 = (ggml_backend_sched_split *)realloc(pgVar13,(long)iVar18 * 0x170);
              sched->splits = pgVar13;
              if (pgVar13 == (ggml_backend_sched_split *)0x0) {
                pcVar23 = "GGML_ASSERT(%s) failed";
                pcVar19 = "sched->splits != NULL";
                iVar7 = 0x480;
                goto LAB_00127800;
              }
            }
            pgVar14 = pgVar13 + iVar8;
            pgVar13[iVar8].backend_id = iVar7;
            pgVar13[iVar8].i_start = (int)uVar29;
            pgVar13[iVar8].n_inputs = 0;
          }
          lVar31 = (long)iVar7;
          lVar20 = 0;
          do {
            pgVar5 = pgVar2->src[lVar20];
            if (pgVar5 != (ggml_tensor *)0x0) {
              sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar5);
              iVar18 = sched->hv_tensor_backend_ids[sVar10];
              if ((pgVar5->flags & 1) != 0) {
                uVar32 = (ulong)sched->n_copies;
                if ((1 < (long)uVar32) &&
                   (sched->hv_tensor_copies
                    [uVar32 * sVar10 * (long)sched->n_backends + (long)(iVar18 * sched->n_copies)]
                    == (ggml_tensor *)0x0)) {
                  uVar36 = SUB84(sched->backends[iVar18],0);
                  uVar39 = (undefined4)((ulong)sched->backends[iVar18] >> 0x20);
                  uVar22 = 0;
                  do {
                    pgVar16 = pgVar5;
                    if (uVar22 != (uint)sched->cur_copy) {
                      pgVar16 = ggml_dup_tensor(sched->ctx,pgVar5);
                      lVar34 = 6;
                      do {
                        pgVar16->ne[lVar34 + -2] = pgVar5->ne[lVar34 + -2];
                        lVar34 = lVar34 + 1;
                      } while (lVar34 != 10);
                      pcVar19 = "NULL";
                      if (CONCAT44(uVar39,uVar36) != 0) {
                        pcVar19 = (char *)(**(code **)(CONCAT44(uVar39,uVar36) + 8))();
                      }
                      ggml_format_name(pgVar16,"%s#%s#%d",pcVar19,pgVar5->name,uVar22 & 0xffffffff);
                      uVar32 = (ulong)(uint)sched->n_copies;
                    }
                    if (1 < (int)uVar32) {
                      ggml_set_input(pgVar16);
                      ggml_set_output(pgVar16);
                      uVar32 = (ulong)(uint)sched->n_copies;
                    }
                    iVar26 = (int)uVar32;
                    sched->hv_tensor_copies
                    [sVar10 * (long)iVar26 * (long)sched->n_backends +
                     (long)(iVar26 * iVar18) + uVar22] = pgVar16;
                    uVar22 = uVar22 + 1;
                  } while ((long)uVar22 < (long)iVar26);
                  iVar26 = sched->n_graph_inputs;
                  sched->n_graph_inputs = iVar26 + 1;
                  if (9 < (long)iVar26) {
                    pcVar23 = "GGML_ASSERT(%s) failed";
                    pcVar19 = "n_graph_inputs < GGML_SCHED_MAX_SPLIT_INPUTS";
                    iVar7 = 0x4a7;
                    goto LAB_00127800;
                  }
                  sched->graph_inputs[iVar26] = pgVar5;
                }
              }
              if ((iVar18 != iVar7) &&
                 (_Var6 = ggml_backend_sched_buffer_supported(sched,pgVar5,iVar7), !_Var6)) {
                ppgVar15 = sched->hv_tensor_copies;
                iVar18 = sched->n_backends;
                iVar26 = sched->n_copies;
                lVar34 = (long)iVar26 * (long)iVar18 * sVar10;
                lVar27 = (long)(iVar26 * iVar7);
                if (ppgVar15[lVar34 + lVar27] == (ggml_tensor *)0x0) {
                  if (0 < iVar26) {
                    pgVar33 = sched->backends[lVar31];
                    pcVar19 = pgVar5->name;
                    uVar32 = 0;
                    do {
                      pgVar16 = ggml_dup_tensor(sched->ctx,pgVar5);
                      lVar34 = 6;
                      do {
                        pgVar16->ne[lVar34 + -2] = pgVar5->ne[lVar34 + -2];
                        lVar34 = lVar34 + 1;
                      } while (lVar34 != 10);
                      pcVar23 = "NULL";
                      if (pgVar33 != (ggml_backend_t)0x0) {
                        pcVar23 = (*(pgVar33->iface).get_name)(pgVar33);
                      }
                      ggml_format_name(pgVar16,"%s#%s#%d",pcVar23,pcVar19,uVar32 & 0xffffffff);
                      iVar26 = sched->n_copies;
                      if (1 < iVar26) {
                        ggml_set_input(pgVar16);
                        ggml_set_output(pgVar16);
                        iVar26 = sched->n_copies;
                      }
                      iVar18 = sched->n_backends;
                      sched->hv_tensor_copies
                      [sVar10 * (long)iVar18 * (long)iVar26 + (long)(iVar26 * iVar7) + uVar32] =
                           pgVar16;
                      uVar32 = uVar32 + 1;
                    } while ((long)uVar32 < (long)iVar26);
                  }
                  iVar1 = pgVar14->n_inputs;
                  pgVar14->n_inputs = iVar1 + 1;
                  if (9 < (long)iVar1) {
                    pcVar23 = "GGML_ASSERT(%s) failed";
                    pcVar19 = "n_inputs < GGML_SCHED_MAX_SPLIT_INPUTS";
                    iVar7 = 0x4bb;
                    goto LAB_00127800;
                  }
                  pgVar14->inputs[iVar1] = pgVar5;
                  ppgVar15 = sched->hv_tensor_copies;
                  lVar34 = sVar10 * (long)iVar18 * (long)iVar26;
                  lVar27 = (long)(iVar26 * iVar7);
                }
                pgVar2->src[lVar20] = ppgVar15[lVar34 + lVar27 + sched->cur_copy];
              }
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 != 10);
          uVar32 = (ulong)(uint)pgVar25->n_nodes;
        }
        uVar29 = uVar29 + 1;
        uVar21 = (uint)uVar32;
      } while ((int)uVar29 < (int)uVar21);
      uVar22 = (ulong)(iVar8 + 1);
    }
  }
  else {
    pgVar30 = &sched->hash_set;
    lVar31 = 0;
    pgVar40 = graph;
    do {
      pgVar2 = graph->nodes[lVar31];
      piVar37 = sched->hv_tensor_backend_ids;
      sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar2);
      if (piVar37[sVar10] == -1) {
        iVar7 = ggml_backend_sched_backend_id_from_cur(sched,pgVar2);
        piVar37[sVar10] = iVar7;
      }
      lVar31 = lVar31 + 1;
      uVar32 = (ulong)graph->n_nodes;
    } while (lVar31 < (long)uVar32);
    pgVar25 = pgVar40;
    if (graph->n_nodes < 1) goto LAB_001269aa;
    lVar31 = 0;
    iVar7 = -1;
    do {
      pgVar2 = pgVar40->nodes[lVar31];
      iVar8 = iVar7;
      if (3 < pgVar2->op - GGML_OP_RESHAPE) {
        piVar37 = sched->hv_tensor_backend_ids;
        sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar2);
        iVar8 = piVar37[sVar10];
        if (iVar8 == -1) {
          if (iVar7 == -1) {
            iVar8 = -1;
          }
          else {
            pgVar3 = sched->backends[iVar7]->device;
            iVar8 = iVar7;
            _Var6 = (*(pgVar3->iface).supports_op)(pgVar3,pgVar2);
            if (_Var6) {
              piVar37[sVar10] = iVar7;
            }
          }
        }
        else if (iVar8 == sched->n_backends + -1) {
          iVar8 = -1;
        }
      }
      lVar31 = lVar31 + 1;
      uVar32 = (ulong)pgVar40->n_nodes;
      iVar7 = iVar8;
    } while (lVar31 < (long)uVar32);
    if (pgVar40->n_nodes < 1) goto LAB_001269aa;
    uVar32 = uVar32 + 1;
    iVar7 = -1;
    do {
      pgVar2 = pgVar25->nodes[uVar32 - 2];
      iVar8 = iVar7;
      if (3 < pgVar2->op - GGML_OP_RESHAPE) {
        piVar37 = sched->hv_tensor_backend_ids;
        sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar2);
        iVar8 = piVar37[sVar10];
        if (iVar8 == -1) {
          if (iVar7 == -1) {
            iVar8 = -1;
          }
          else {
            pgVar3 = sched->backends[iVar7]->device;
            _Var6 = (*(pgVar3->iface).supports_op)(pgVar3,pgVar2);
            iVar8 = iVar7;
            if (_Var6) {
              piVar37[sVar10] = iVar7;
            }
          }
        }
        else if (iVar8 == sched->n_backends + -1) {
          iVar8 = -1;
        }
      }
      uVar32 = uVar32 - 1;
      iVar7 = iVar8;
    } while (1 < uVar32);
    uVar32 = (ulong)(uint)pgVar25->n_nodes;
    if (pgVar25->n_nodes < 1) goto LAB_001269aa;
    iVar7 = -1;
    lVar31 = 0;
    do {
      pgVar2 = pgVar25->nodes[lVar31];
      iVar8 = iVar7;
      if (3 < pgVar2->op - GGML_OP_RESHAPE) {
        piVar37 = sched->hv_tensor_backend_ids;
        sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar2);
        iVar8 = piVar37[sVar10];
        if (iVar8 == -1) {
          if (iVar7 == -1) {
            iVar8 = -1;
          }
          else {
            pgVar3 = sched->backends[iVar7]->device;
            _Var6 = (*(pgVar3->iface).supports_op)(pgVar3,pgVar2);
            iVar8 = iVar7;
            if (_Var6) {
              piVar37[sVar10] = iVar7;
            }
          }
        }
      }
      iVar7 = iVar8;
      lVar31 = lVar31 + 1;
      uVar32 = (ulong)pgVar25->n_nodes;
    } while (lVar31 < (long)uVar32);
    if (pgVar25->n_nodes < 1) goto LAB_001269aa;
    uVar32 = uVar32 + 1;
    iVar7 = -1;
    do {
      pgVar2 = pgVar25->nodes[uVar32 - 2];
      iVar8 = iVar7;
      if (3 < pgVar2->op - GGML_OP_RESHAPE) {
        piVar37 = sched->hv_tensor_backend_ids;
        sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar2);
        iVar8 = piVar37[sVar10];
        if (iVar8 == -1) {
          if (iVar7 == -1) {
            iVar8 = -1;
          }
          else {
            pgVar3 = sched->backends[iVar7]->device;
            _Var6 = (*(pgVar3->iface).supports_op)(pgVar3,pgVar2);
            iVar8 = iVar7;
            if (_Var6) {
              piVar37[sVar10] = iVar7;
            }
          }
        }
      }
      uVar32 = uVar32 - 1;
      iVar7 = iVar8;
    } while (1 < uVar32);
    uVar32 = (ulong)(uint)pgVar25->n_nodes;
    if (pgVar25->n_nodes < 1) goto LAB_001269aa;
    lVar31 = 0;
    do {
      pgVar2 = pgVar25->nodes[lVar31];
      uVar36 = SUB84(pgVar2,0);
      uVar39 = (undefined4)((ulong)pgVar2 >> 0x20);
      if (3 < pgVar2->op - GGML_OP_RESHAPE) {
        piVar37 = sched->hv_tensor_backend_ids;
        sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar2);
        uVar21 = piVar37[sVar10];
        uVar32 = (ulong)uVar21;
        if (uVar21 == 0xffffffff) {
          if (0 < sched->n_backends) {
            iVar7 = -1;
            lVar20 = 0;
            do {
              pgVar3 = sched->backends[lVar20]->device;
              _Var6 = (*(pgVar3->iface).supports_op)(pgVar3,(ggml_tensor *)CONCAT44(uVar39,uVar36));
              if (_Var6) {
                lVar34 = 0;
                iVar8 = 0;
                do {
                  pgVar2 = *(ggml_tensor **)(CONCAT44(uVar39,uVar36) + 0x98 + lVar34 * 8);
                  if ((pgVar2 != (ggml_tensor *)0x0) &&
                     ((piVar4 = sched->hv_tensor_backend_ids,
                      sVar11 = ggml_hash_find_or_insert(pgVar30,pgVar2), piVar4[sVar11] != -1 ||
                      (piVar4 = sched->hv_tensor_backend_ids,
                      sVar11 = ggml_hash_find_or_insert(pgVar30,pgVar2->view_src),
                      piVar4[sVar11] != -1)))) {
                    _Var6 = ggml_backend_sched_buffer_supported(sched,pgVar2,(int)lVar20);
                    iVar8 = iVar8 + (uint)_Var6;
                  }
                  lVar34 = lVar34 + 1;
                } while (lVar34 != 10);
                if (iVar7 < iVar8) {
                  piVar37[sVar10] = (int)lVar20;
                  iVar7 = iVar8;
                }
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 < sched->n_backends);
          }
        }
        else if (0 < (int)uVar21) {
          lVar20 = 0;
          do {
            if ((sched->bufts[lVar20] == sched->bufts[(int)uVar32]) &&
               (pgVar3 = sched->backends[lVar20]->device,
               _Var6 = (*(pgVar3->iface).supports_op)(pgVar3,(ggml_tensor *)CONCAT44(uVar39,uVar36))
               , _Var6)) {
              lVar34 = 0;
              while( true ) {
                pgVar2 = *(ggml_tensor **)(CONCAT44(uVar39,uVar36) + 0x98 + lVar34 * 8);
                if ((pgVar2 != (ggml_tensor *)0x0) &&
                   (_Var6 = ggml_backend_sched_buffer_supported(sched,pgVar2,(int)lVar20), !_Var6))
                break;
                lVar34 = lVar34 + 1;
                if (lVar34 == 10) {
                  piVar37[sVar10] = (int)lVar20;
                  goto LAB_00126856;
                }
              }
            }
            lVar20 = lVar20 + 1;
            uVar32 = (ulong)piVar37[sVar10];
          } while (lVar20 < (long)uVar32);
        }
      }
LAB_00126856:
      lVar31 = lVar31 + 1;
      uVar32 = (ulong)pgVar25->n_nodes;
    } while (lVar31 < (long)uVar32);
    if (pgVar25->n_nodes < 1) goto LAB_001269aa;
    lVar31 = 0;
    do {
      uVar36 = (undefined4)lVar31;
      uVar39 = (undefined4)((ulong)lVar31 >> 0x20);
      pgVar2 = pgVar25->nodes[lVar31];
      piVar37 = sched->hv_tensor_backend_ids;
      sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar2);
      piVar37 = piVar37 + sVar10;
      if ((pgVar2->view_src != (ggml_tensor *)0x0) && (*piVar37 == -1)) {
        piVar4 = sched->hv_tensor_backend_ids;
        sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar2->view_src);
        *piVar37 = piVar4[sVar10];
      }
      lVar31 = 0;
      do {
        pgVar5 = pgVar2->src[lVar31];
        if (pgVar5 != (ggml_tensor *)0x0) {
          piVar4 = sched->hv_tensor_backend_ids;
          piVar12 = piVar37;
          sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar5);
          piVar37 = piVar12;
          if (piVar4[sVar10] == -1) {
            if (pgVar5->view_src != (ggml_tensor *)0x0) {
              piVar12 = sched->hv_tensor_backend_ids;
              sVar11 = ggml_hash_find_or_insert(pgVar30,pgVar5->view_src);
              piVar12 = piVar12 + sVar11;
            }
            piVar4[sVar10] = *piVar12;
          }
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 != 10);
      lVar31 = CONCAT44(uVar39,uVar36) + 1;
      uVar21 = pgVar25->n_nodes;
      uVar32 = (ulong)(int)uVar21;
    } while (lVar31 < (long)uVar32);
    pgVar14 = sched->splits;
    if ((int)uVar21 < 1) goto LAB_001269b8;
    uVar29 = 0;
    do {
      if (3 < pgVar25->nodes[uVar29]->op - GGML_OP_RESHAPE) {
        piVar37 = sched->hv_tensor_backend_ids;
        sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar25->nodes[uVar29]);
        pgVar14->backend_id = piVar37[sVar10];
        uVar32 = (ulong)(uint)pgVar25->n_nodes;
        goto LAB_001269bb;
      }
      uVar29 = uVar29 + 1;
    } while (uVar21 != uVar29);
    pgVar14->i_start = 0;
    pgVar14->n_inputs = 0;
    uVar22 = 1;
  }
  ppgVar24 = &sched->splits;
  pgVar14->i_end = uVar21;
  sched->n_splits = (int)uVar22;
  pgVar40 = pgVar25;
  if (((int)uVar21 < 1) || (sched->debug == 0)) {
    iVar7 = pgVar25->n_nodes;
  }
  else {
    uVar32 = 0;
    uVar29 = 0;
    do {
      iVar7 = (int)uVar29;
      if (iVar7 < sched->n_splits) {
        pgVar14 = *ppgVar24;
        if (uVar32 == (uint)pgVar14[iVar7].i_start) {
          uVar36 = (undefined4)uVar32;
          uVar39 = (undefined4)(uVar32 >> 0x20);
          pgVar33 = sched->backends[pgVar14[iVar7].backend_id];
          pcVar19 = "NULL";
          pgVar25 = pgVar40;
          if (pgVar33 != (ggml_backend_t)0x0) {
            pcVar19 = (*(pgVar33->iface).get_name)(pgVar33);
            pgVar14 = *ppgVar24;
            pgVar25 = pgVar40;
          }
          iVar8 = iVar7;
          ggml_log_internal(GGML_LOG_LEVEL_DEBUG,"\n## SPLIT #%d: %s # %d inputs",uVar29,pcVar19,
                            (ulong)(uint)pgVar14[iVar7].n_inputs);
          pgVar14 = *ppgVar24;
          if (0 < pgVar14[iVar7].n_inputs) {
            lVar31 = 0;
            do {
              if (lVar31 == 0) {
                ggml_log_internal(GGML_LOG_LEVEL_DEBUG,": ");
                pgVar14 = *ppgVar24;
              }
              pgVar2 = pgVar14[iVar7].inputs[lVar31];
              sVar10 = ggml_nbytes(pgVar2);
              pcVar19 = "%zuK";
              if (0xfffff < sVar10) {
                pcVar19 = "%zuM";
              }
              sVar17 = 10;
              if (0xfffff < sVar10) {
                sVar17 = 0x14;
              }
              snprintf(fmt_size(unsigned_long)::buffer,0x80,pcVar19,sVar10 >> sVar17);
              ggml_log_internal(GGML_LOG_LEVEL_DEBUG,"[%s (%5.5s)] ",pgVar2->name,
                                fmt_size(unsigned_long)::buffer);
              lVar31 = lVar31 + 1;
              pgVar14 = *ppgVar24;
            } while (lVar31 < pgVar14[iVar7].n_inputs);
          }
          ggml_log_internal(GGML_LOG_LEVEL_DEBUG,"\n");
          uVar29 = (ulong)(iVar8 + 1);
          uVar32 = CONCAT44(uVar39,uVar36);
          pgVar40 = pgVar25;
        }
      }
      pgVar2 = pgVar25->nodes[uVar32];
      if ((3 < pgVar2->op - GGML_OP_RESHAPE) && (1 < sched->debug)) {
        uVar21 = (uint)uVar29;
        piVar37 = sched->hv_tensor_backend_ids;
        sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
        if ((long)piVar37[sVar10] == -1) {
          pgVar33 = (ggml_backend_t)0x0;
        }
        else {
          pgVar33 = sched->backends[piVar37[sVar10]];
        }
        pcVar19 = ggml_op_name(pgVar2->op);
        sVar10 = ggml_nbytes(pgVar2);
        pcVar23 = "%zuK";
        if (0xfffff < sVar10) {
          pcVar23 = "%zuM";
        }
        sVar17 = 10;
        if (0xfffff < sVar10) {
          sVar17 = 0x14;
        }
        snprintf(fmt_size(unsigned_long)::buffer,0x80,pcVar23,sVar10 >> sVar17);
        pcVar23 = "NULL";
        pgVar25 = pgVar40;
        if (pgVar33 != (ggml_backend_t)0x0) {
          pcVar23 = (*(pgVar33->iface).get_name)(pgVar33);
          pgVar25 = pgVar40;
        }
        uVar36 = (undefined4)uVar32;
        uVar39 = (undefined4)(uVar32 >> 0x20);
        ggml_log_internal(GGML_LOG_LEVEL_DEBUG,"node #%3d (%10.10s): %20.20s (%5.5s) [%5.5s %8.8s]:"
                          ,uVar32 & 0xffffffff,pcVar19,pgVar2->name,fmt_size(unsigned_long)::buffer,
                          pcVar23,"");
        lVar31 = 0;
        do {
          pgVar5 = pgVar2->src[lVar31];
          if (pgVar5 != (ggml_tensor *)0x0) {
            piVar37 = sched->hv_tensor_backend_ids;
            sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar5);
            if ((long)piVar37[sVar10] == -1) {
              pgVar33 = (ggml_backend_t)0x0;
            }
            else {
              pgVar33 = sched->backends[piVar37[sVar10]];
            }
            sVar10 = ggml_nbytes(pgVar5);
            pcVar19 = "%zuK";
            if (0xfffff < sVar10) {
              pcVar19 = "%zuM";
            }
            sVar17 = 10;
            if (0xfffff < sVar10) {
              sVar17 = 0x14;
            }
            snprintf(fmt_size(unsigned_long)::buffer,0x80,pcVar19,sVar10 >> sVar17);
            pcVar19 = "NULL";
            if (pgVar33 != (ggml_backend_t)0x0) {
              pcVar19 = (*(pgVar33->iface).get_name)(pgVar33);
            }
            ggml_log_internal(GGML_LOG_LEVEL_DEBUG," %20.20s (%5.5s) [%5.5s %8.8s]",pgVar5->name,
                              fmt_size(unsigned_long)::buffer,pcVar19,"");
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != 10);
        ggml_log_internal(GGML_LOG_LEVEL_DEBUG,"\n");
        uVar32 = CONCAT44(uVar39,uVar36);
        uVar29 = (ulong)uVar21;
        pgVar40 = pgVar25;
      }
      uVar32 = uVar32 + 1;
      iVar7 = pgVar25->n_nodes;
    } while ((long)uVar32 < (long)iVar7);
    uVar22 = (ulong)(uint)sched->n_splits;
  }
  piVar37 = sched->node_backend_ids;
  piVar4 = sched->leaf_backend_ids;
  sched->node_backend_ids = sched->prev_node_backend_ids;
  sched->leaf_backend_ids = sched->prev_leaf_backend_ids;
  sched->prev_node_backend_ids = piVar37;
  sched->prev_leaf_backend_ids = piVar4;
  iVar8 = pgVar25->n_leafs;
  if (pgVar25->n_leafs < iVar7) {
    iVar8 = iVar7;
  }
  iVar8 = iVar8 + sched->n_copies * (int)uVar22 * 0x14;
  if (iVar8 <= (sched->graph).size) {
LAB_00127346:
    (sched->graph).n_nodes = 0;
    (sched->graph).n_leafs = 0;
    if (0 < (int)uVar22) {
      pgVar30 = &sched->hash_set;
      local_c8 = 0x10;
      lVar31 = 0;
      pgVar38 = pgVar30;
      do {
        pgVar13 = *ppgVar24;
        uVar36 = (undefined4)lVar31;
        uVar39 = (undefined4)((ulong)lVar31 >> 0x20);
        pgVar14 = pgVar13 + lVar31;
        ggml_graph_view(&local_80,pgVar25,pgVar13[lVar31].i_start,pgVar13[lVar31].i_end);
        pgVar25 = &local_80;
        pgVar28 = &pgVar13[lVar31].graph;
        for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
          iVar7 = pgVar25->n_nodes;
          pgVar28->size = pgVar25->size;
          pgVar28->n_nodes = iVar7;
          pgVar25 = (ggml_cgraph *)((long)pgVar25 + (ulong)bVar35 * -0x10 + 8);
          pgVar28 = (ggml_cgraph *)((long)pgVar28 + (ulong)bVar35 * -0x10 + 8);
        }
        pgVar25 = pgVar40;
        if (0 < pgVar13[lVar31].n_inputs) {
          lVar31 = 0;
          do {
            pgVar2 = *(ggml_tensor **)((long)pgVar13->inputs + lVar31 * 8 + local_c8 + -0x10);
            sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar2);
            pgVar5 = sched->hv_tensor_copies
                     [(long)sched->n_backends * (long)sched->n_copies * sVar10 +
                      (long)pgVar14->backend_id * (long)sched->n_copies + (long)sched->cur_copy];
            pgVar30 = pgVar38;
            pgVar16 = ggml_view_tensor(sched->ctx,pgVar2);
            pgVar16->src[0] = pgVar2;
            sched->node_backend_ids[(sched->graph).n_nodes] = sched->hv_tensor_backend_ids[sVar10];
            iVar7 = (sched->graph).n_nodes;
            (sched->graph).n_nodes = iVar7 + 1;
            (sched->graph).nodes[iVar7] = pgVar16;
            sched->node_backend_ids[(long)iVar7 + 1] = pgVar14->backend_id;
            iVar7 = (sched->graph).n_nodes;
            (sched->graph).n_nodes = iVar7 + 1;
            (sched->graph).nodes[iVar7] = pgVar5;
            lVar31 = lVar31 + 1;
            pgVar38 = pgVar30;
          } while (lVar31 < pgVar14->n_inputs);
        }
        lVar31 = (long)pgVar14->i_start;
        pgVar40 = pgVar25;
        if (pgVar14->i_start < pgVar14->i_end) {
          do {
            piVar37 = sched->hv_tensor_backend_ids;
            sVar10 = ggml_hash_find_or_insert(pgVar30,pgVar25->nodes[lVar31]);
            sched->node_backend_ids[(sched->graph).n_nodes] = piVar37[sVar10];
            pgVar2 = pgVar25->nodes[lVar31];
            iVar7 = (sched->graph).n_nodes;
            (sched->graph).n_nodes = iVar7 + 1;
            (sched->graph).nodes[iVar7] = pgVar2;
            lVar31 = lVar31 + 1;
          } while (lVar31 < pgVar14->i_end);
        }
        lVar31 = CONCAT44(uVar39,uVar36) + 1;
        uVar22 = (ulong)sched->n_splits;
        local_c8 = local_c8 + 0xb8;
      } while (lVar31 < (long)uVar22);
    }
    if (1 < sched->n_copies) {
      if (0 < sched->n_graph_inputs) {
        lVar31 = 0;
        pgVar25 = pgVar40;
        do {
          pgVar2 = sched->graph_inputs[lVar31];
          sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
          piVar37 = sched->hv_tensor_backend_ids;
          sVar11 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
          uVar32 = (ulong)(uint)sched->n_copies;
          if (0 < sched->n_copies) {
            iVar7 = piVar37[sVar11];
            iVar8 = (sched->graph).n_leafs;
            lVar20 = 0;
            do {
              pgVar2 = sched->hv_tensor_copies
                       [sVar10 * (long)(int)uVar32 * (long)sched->n_backends +
                        (int)uVar32 * iVar7 + lVar20];
              sched->leaf_backend_ids[iVar8] = iVar7;
              iVar18 = (sched->graph).n_leafs;
              iVar8 = iVar18 + 1;
              (sched->graph).n_leafs = iVar8;
              (sched->graph).leafs[iVar18] = pgVar2;
              lVar20 = lVar20 + 1;
              uVar32 = (ulong)sched->n_copies;
            } while (lVar20 < (long)uVar32);
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 < sched->n_graph_inputs);
        uVar22 = (ulong)(uint)sched->n_splits;
        pgVar40 = pgVar25;
      }
      if (0 < (int)uVar22) {
        lVar31 = 0;
        do {
          pgVar14 = *ppgVar24;
          if (0 < pgVar14[lVar31].n_inputs) {
            iVar7 = pgVar14[lVar31].backend_id;
            lVar20 = 0;
            pgVar25 = pgVar40;
            do {
              sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar14[lVar31].inputs[lVar20]);
              uVar32 = (ulong)(uint)sched->n_copies;
              if (0 < sched->n_copies) {
                iVar8 = (sched->graph).n_leafs;
                lVar34 = 0;
                do {
                  pgVar2 = sched->hv_tensor_copies
                           [sVar10 * (long)(int)uVar32 * (long)sched->n_backends +
                            (int)uVar32 * iVar7 + lVar34];
                  sched->leaf_backend_ids[iVar8] = iVar7;
                  iVar18 = (sched->graph).n_leafs;
                  iVar8 = iVar18 + 1;
                  (sched->graph).n_leafs = iVar8;
                  (sched->graph).leafs[iVar18] = pgVar2;
                  lVar34 = lVar34 + 1;
                  uVar32 = (ulong)sched->n_copies;
                } while (lVar34 < (long)uVar32);
              }
              lVar20 = lVar20 + 1;
            } while (lVar20 < pgVar14[lVar31].n_inputs);
            uVar22 = (ulong)(uint)sched->n_splits;
            pgVar40 = pgVar25;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 < (int)uVar22);
      }
    }
    if (0 < pgVar25->n_leafs) {
      lVar31 = 0;
      do {
        pgVar2 = pgVar25->leafs[lVar31];
        piVar37 = sched->hv_tensor_backend_ids;
        pgVar25 = pgVar40;
        sVar10 = ggml_hash_find_or_insert(&sched->hash_set,pgVar2);
        sched->leaf_backend_ids[(sched->graph).n_leafs] = piVar37[sVar10];
        iVar7 = (sched->graph).n_leafs;
        (sched->graph).n_leafs = iVar7 + 1;
        (sched->graph).leafs[iVar7] = pgVar2;
        lVar31 = lVar31 + 1;
        pgVar40 = pgVar25;
      } while (lVar31 < pgVar25->n_leafs);
    }
    return;
  }
  (sched->graph).size = iVar8;
  ppgVar15 = (ggml_tensor **)realloc((sched->graph).nodes,(long)iVar8 << 3);
  (sched->graph).nodes = ppgVar15;
  ppgVar15 = (ggml_tensor **)realloc((sched->graph).leafs,(long)iVar8 << 3);
  (sched->graph).leafs = ppgVar15;
  if ((sched->graph).nodes == (ggml_tensor **)0x0) {
    pcVar23 = "GGML_ASSERT(%s) failed";
    pcVar19 = "sched->graph.nodes != NULL";
    iVar7 = 0x4da;
  }
  else {
    if (ppgVar15 != (ggml_tensor **)0x0) {
      uVar22 = (ulong)(uint)sched->n_splits;
      goto LAB_00127346;
    }
    pcVar23 = "GGML_ASSERT(%s) failed";
    pcVar19 = "sched->graph.leafs != NULL";
    iVar7 = 0x4db;
  }
LAB_00127800:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
             ,iVar7,pcVar23,pcVar19);
}

Assistant:

static void ggml_backend_sched_split_graph(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    // reset splits
    sched->n_splits = 0;
    sched->n_graph_inputs = 0;
    sched->is_reset = false;

    struct ggml_init_params params = {
        /* .mem_size =   */ sched->context_buffer_size,
        /* .mem_buffer = */ sched->context_buffer,
        /* .no_alloc =   */ true
    };

    ggml_free(sched->ctx);

    sched->ctx = ggml_init(params);
    if (sched->ctx == NULL) {
        GGML_ABORT("%s: failed to initialize context\n", __func__);
    }

    // pass 1: assign backends to ops with pre-allocated inputs
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        int * leaf_backend_id = &tensor_backend_id(leaf);
        // do not overwrite user assignments
        if (*leaf_backend_id == -1) {
            *leaf_backend_id = ggml_backend_sched_backend_id_from_cur(sched, leaf);
        }
    }

    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        int * node_backend_id = &tensor_backend_id(node);
        // do not overwrite user assignments
        if (*node_backend_id == -1) {
            *node_backend_id = ggml_backend_sched_backend_id_from_cur(sched, node);

#if 0
            // src
            if (node->op == GGML_OP_NONE) {
                continue;
            }

            for (int j = 0; j < GGML_MAX_SRC; j++) {
                struct ggml_tensor * src = node->src[j];
                if (src == NULL) {
                    continue;
                }
                int * src_backend_id = &tensor_backend_id(src);
                if (*src_backend_id == -1) {
                    *src_backend_id = ggml_backend_sched_backend_id_from_cur(sched, src);
                }
            }
#endif
        }
    }

    // pass 2: expand current backend assignments
    // assign the same backend to adjacent nodes
    // expand gpu backends (i.e. non last prio) up and down, ignoring cpu (the lowest priority backend)
    // thus, cpu will never be used unless weights are on cpu, or there are no gpu ops between cpu ops
    // ops unsupported by the backend being expanded will be left unassigned so that they can be assigned later when the locations of its inputs are known
    // expand gpu down
    {
        int cur_backend_id = -1;
        for (int i = 0; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                if (*node_backend_id == sched->n_backends - 1) {
                    // skip cpu (lowest prio backend)
                    cur_backend_id = -1;
                } else {
                    cur_backend_id = *node_backend_id;
                }
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }
    // expand gpu up
    {
        int cur_backend_id = -1;
        for (int i = graph->n_nodes - 1; i >= 0; i--) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                if (*node_backend_id == sched->n_backends - 1) {
                    // skip cpu (lowest prio backend)
                    cur_backend_id = -1;
                } else {
                    cur_backend_id = *node_backend_id;
                }
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }
    // expand rest down
    {
        int cur_backend_id = -1;
        for (int i = 0; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                cur_backend_id = *node_backend_id;
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }
    // expand rest up
    {
        int cur_backend_id = -1;
        for (int i = graph->n_nodes - 1; i >= 0; i--) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                cur_backend_id = *node_backend_id;
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }

    // pass 3: upgrade nodes to higher prio backends with compatible buffer types
    // if the tensor is already in the same buffer type (*) as another higher priority backend, we should move it there
    // however, we also need to verify that the sources are in compatible buffer types
    // (*) the actual requirement is more relaxed, the buffer type of the backend should be supported by all the users of this tensor further down the graph
    // however, this is slow to verify, so we have a more strict requirement that the buffer type is the same
    // this is not uncommon since multiple backends can use host memory, with the same buffer type (eg. BLAS and CPU)
    // additionally, set remaining unassigned nodes to the backend with the most supported inputs
    // only nodes that could not be assigned during expansion due to the backend not supporting the op should be unassigned at this point
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        if (ggml_is_view_op(node->op)) {
            continue;
        }
        int * node_backend_id = &tensor_backend_id(node);
        if (*node_backend_id == -1) {
            // unassigned node: find the backend with the most supported inputs
            int n_supported_best = -1;
            for (int b = 0; b < sched->n_backends; b++) {
                if (ggml_backend_supports_op(sched->backends[b], node)) {
                    int n_supported = 0;
                    for (int j = 0; j < GGML_MAX_SRC; j++) {
                        struct ggml_tensor * src = node->src[j];
                        if (src == NULL) {
                            continue;
                        }
                        if ((tensor_backend_id(src) != -1 || tensor_backend_id(src->view_src) != -1) && ggml_backend_sched_buffer_supported(sched, src, b)) {
                            n_supported++;
                        }
                    }
                    if (n_supported > n_supported_best) {
                        n_supported_best = n_supported;
                        *node_backend_id = b;
                        SET_CAUSE(node, "3.best");
                    }
                }
            }
        } else {
            // assigned node: upgrade to higher prio backend if possible
            for (int b = 0; b < *node_backend_id; b++) {
                if (sched->bufts[b] == sched->bufts[*node_backend_id] && ggml_backend_supports_op(sched->backends[b], node)) {
                    bool supported = true;
                    for (int j = 0; j < GGML_MAX_SRC; j++) {
                        struct ggml_tensor * src = node->src[j];
                        if (src == NULL) {
                            continue;
                        }
                        if (!ggml_backend_sched_buffer_supported(sched, src, b)) {
                            supported = false;
                            break;
                        }
                    }
                    if (supported) {
                        *node_backend_id = b;
                        SET_CAUSE(node, "3.upg");
                        break;
                    }
                }
            }
        }
    }

    // pass 4: assign backends to remaining src from dst and view_src
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        int * cur_backend_id = &tensor_backend_id(node);
        if (node->view_src != NULL && *cur_backend_id == -1) {
            *cur_backend_id = tensor_backend_id(node->view_src);
            SET_CAUSE(node, "4.vsrc");
        }
        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * src = node->src[j];
            if (src == NULL) {
                continue;
            }
            int * src_backend_id = &tensor_backend_id(src);
            if (*src_backend_id == -1) {
                if (src->view_src != NULL) {
                    // views are always on the same backend as the source
                    *src_backend_id = tensor_backend_id(src->view_src);
                    SET_CAUSE(src, "4.vsrc");
                } else {
                    *src_backend_id = *cur_backend_id;
                    SET_CAUSE(src, "4.cur");
                }
            }
        }
    }

    // pass 5: split graph, find tensors that need to be copied
    {
        int i_split = 0;
        struct ggml_backend_sched_split * split = &sched->splits[0];
        // find the backend of the first split, skipping view ops
        int i = 0;
        for (; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];
            if (!ggml_is_view_op(node->op)) {
                split->backend_id = tensor_backend_id(node);
                break;
            }
        }
        split->i_start = 0;
        split->n_inputs = 0;
        int cur_backend_id = split->backend_id;
        for (; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];

            if (ggml_is_view_op(node->op)) {
                continue;
            }

            const int node_backend_id = tensor_backend_id(node);

            assert(node_backend_id != -1); // all nodes should be assigned by now

            // check if we should start a new split based on the sources of the current node
            bool need_new_split = false;
            if (node_backend_id == cur_backend_id && split->n_inputs > 0) {
                for (int j = 0; j < GGML_MAX_SRC; j++) {
                    struct ggml_tensor * src = node->src[j];
                    if (src == NULL) {
                        continue;
                    }
                    // check if a weight is on a different and incompatible backend
                    // by starting a new split, the memory of the previously offloaded weights can be reused
                    if (src->buffer != NULL && src->buffer->usage == GGML_BACKEND_BUFFER_USAGE_WEIGHTS) {
                        int src_backend_id = tensor_backend_id(src);
                        if (src_backend_id != cur_backend_id && !ggml_backend_sched_buffer_supported(sched, src, cur_backend_id)) {
                            need_new_split = true;
                            break;
                        }
                    }
                    // check if the split has too many inputs
                    // FIXME: count the number of inputs instead of only checking when full
                    if (split->n_inputs == GGML_SCHED_MAX_SPLIT_INPUTS) {
                        const size_t id = hash_id(src);
                        int src_backend_id = sched->hv_tensor_backend_ids[id];
                        bool supported = ggml_backend_sched_buffer_supported(sched, src, cur_backend_id);
                        if (src_backend_id != cur_backend_id && tensor_id_copy(id, cur_backend_id, 0) == NULL && !supported) {
                            need_new_split = true;
                            break;
                        }
                    }
                }
            }

            if (node_backend_id != cur_backend_id || need_new_split) {
                split->i_end = i;
                i_split++;
                if (i_split >= sched->splits_capacity) {
                    sched->splits_capacity *= 2;
                    sched->splits = (ggml_backend_sched_split *)
                        realloc(sched->splits, sched->splits_capacity * sizeof(struct ggml_backend_sched_split));
                    GGML_ASSERT(sched->splits != NULL);
                }
                split = &sched->splits[i_split];
                split->backend_id = node_backend_id;
                split->i_start = i;
                split->n_inputs = 0;
                cur_backend_id = node_backend_id;
            }

            // find inputs that are not on the same backend
            for (int j = 0; j < GGML_MAX_SRC; j++) {
                struct ggml_tensor * src = node->src[j];
                if (src == NULL) {
                    continue;
                }

                size_t src_id = hash_id(src);
                const int src_backend_id = sched->hv_tensor_backend_ids[src_id];
                assert(src_backend_id != -1); // all inputs should be assigned by now

                if (src->flags & GGML_TENSOR_FLAG_INPUT && sched->n_copies > 1) {
                    if (tensor_id_copy(src_id, src_backend_id, 0) == NULL) {
                        ggml_backend_t backend = sched->backends[src_backend_id];
                        for (int c = 0; c < sched->n_copies; c++) {
                            struct ggml_tensor * tensor_copy;
                            if (c == sched->cur_copy) {
                                tensor_copy = src; // use the original tensor as the current copy
                            } else {
                                tensor_copy = ggml_dup_tensor_layout(sched->ctx, src);
                                ggml_format_name(tensor_copy, "%s#%s#%d", ggml_backend_name(backend), src->name, c);
                            }
                            if (sched->n_copies > 1) {
                                ggml_set_input(tensor_copy);
                                ggml_set_output(tensor_copy); // prevent ggml-alloc from overwriting the tensor
                            }
                            tensor_id_copy(src_id, src_backend_id, c) = tensor_copy;
                            SET_CAUSE(tensor_copy, "4.cpy");
                        }
                        int n_graph_inputs = sched->n_graph_inputs++;
                        GGML_ASSERT(n_graph_inputs < GGML_SCHED_MAX_SPLIT_INPUTS);
                        sched->graph_inputs[n_graph_inputs] = src;
                    }
                }

                if (src_backend_id != cur_backend_id && !ggml_backend_sched_buffer_supported(sched, src, cur_backend_id)) {
                    // create a copy of the input in the split's backend
                    if (tensor_id_copy(src_id, cur_backend_id, 0) == NULL) {
                        ggml_backend_t backend = sched->backends[cur_backend_id];
                        for (int c = 0; c < sched->n_copies; c++) {
                            struct ggml_tensor * tensor_copy = ggml_dup_tensor_layout(sched->ctx, src);
                            ggml_format_name(tensor_copy, "%s#%s#%d", ggml_backend_name(backend), src->name, c);
                            if (sched->n_copies > 1) {
                                ggml_set_input(tensor_copy);
                                ggml_set_output(tensor_copy); // prevent ggml-alloc from overwriting the tensor
                            }
                            tensor_id_copy(src_id, cur_backend_id, c) = tensor_copy;
                            SET_CAUSE(tensor_copy, "4.cpy");
                        }
                        int n_inputs = split->n_inputs++;
                        GGML_ASSERT(n_inputs < GGML_SCHED_MAX_SPLIT_INPUTS);
                        split->inputs[n_inputs] = src;
                    }
                    node->src[j] = tensor_id_copy(src_id, cur_backend_id, sched->cur_copy);
                }
            }
        }
        split->i_end = graph->n_nodes;
        sched->n_splits = i_split + 1;
    }

    if (sched->debug) {
        ggml_backend_sched_print_assignments(sched, graph);
    }

    // swap node_backend_ids and leaf _backend_ids with prevs
    {
        int * tmp = sched->node_backend_ids;
        sched->node_backend_ids = sched->prev_node_backend_ids;
        sched->prev_node_backend_ids = tmp;

        tmp = sched->leaf_backend_ids;
        sched->leaf_backend_ids = sched->prev_leaf_backend_ids;
        sched->prev_leaf_backend_ids = tmp;
    }

    int graph_size = std::max(graph->n_nodes, graph->n_leafs) + sched->n_splits*GGML_SCHED_MAX_SPLIT_INPUTS*2*sched->n_copies;
    if (sched->graph.size < graph_size) {
        sched->graph.size = graph_size;
        sched->graph.nodes = (ggml_tensor **) realloc(sched->graph.nodes, graph_size * sizeof(struct ggml_tensor *));
        sched->graph.leafs = (ggml_tensor **) realloc(sched->graph.leafs, graph_size * sizeof(struct ggml_tensor *));
        GGML_ASSERT(sched->graph.nodes != NULL);
        GGML_ASSERT(sched->graph.leafs != NULL);
    }
    sched->graph.n_nodes = 0;
    sched->graph.n_leafs = 0;

    struct ggml_cgraph * graph_copy = &sched->graph;

    for (int i = 0; i < sched->n_splits; i++) {
        struct ggml_backend_sched_split * split = &sched->splits[i];
        split->graph = ggml_graph_view(graph, split->i_start, split->i_end);

        // add inputs to the graph copy so that they are allocated by ggml-alloc at the start of the split
        for (int j = 0; j < split->n_inputs; j++) {
            assert(graph_copy->size > (graph_copy->n_nodes + 1));

            struct ggml_tensor * input = split->inputs[j];
            const size_t input_id = hash_id(input);
            struct ggml_tensor * input_cpy = tensor_id_copy(input_id, split->backend_id, sched->cur_copy);

            // add a dependency to the input source so that it is not freed before the copy is done
            struct ggml_tensor * input_dep = ggml_view_tensor(sched->ctx, input);
            input_dep->src[0] = input;
            sched->node_backend_ids[graph_copy->n_nodes] = sched->hv_tensor_backend_ids[input_id];
            graph_copy->nodes[graph_copy->n_nodes++] = input_dep;

            // add a dependency to the input copy so that it is allocated at the start of the split
            sched->node_backend_ids[graph_copy->n_nodes] = split->backend_id;
            graph_copy->nodes[graph_copy->n_nodes++] = input_cpy;
        }

        for (int j = split->i_start; j < split->i_end; j++) {
            assert(graph_copy->size > graph_copy->n_nodes);
            sched->node_backend_ids[graph_copy->n_nodes] = tensor_backend_id(graph->nodes[j]);
            graph_copy->nodes[graph_copy->n_nodes++] = graph->nodes[j];
        }
    }

    if (sched->n_copies > 1) {
        // add input copies as leafs so that they are allocated first
        for (int i = 0; i < sched->n_graph_inputs; i++) {
            struct ggml_tensor * input = sched->graph_inputs[i];
            size_t id = hash_id(input);
            int backend_id = tensor_backend_id(input);
            for (int c = 0; c < sched->n_copies; c++) {
                struct ggml_tensor * input_cpy = tensor_id_copy(id, backend_id, c);
                sched->leaf_backend_ids[graph_copy->n_leafs] = backend_id;
                assert(graph_copy->size > graph_copy->n_leafs);
                graph_copy->leafs[graph_copy->n_leafs++] = input_cpy;
            }
        }

        for (int i = 0; i < sched->n_splits; i++) {
            struct ggml_backend_sched_split * split = &sched->splits[i];
            int backend_id = split->backend_id;
            for (int j = 0; j < split->n_inputs; j++) {
                struct ggml_tensor * input = split->inputs[j];
                size_t id = hash_id(input);
                for (int c = 0; c < sched->n_copies; c++) {
                    struct ggml_tensor * input_cpy = tensor_id_copy(id, backend_id, c);
                    sched->leaf_backend_ids[graph_copy->n_leafs] = backend_id;
                    assert(graph_copy->size > graph_copy->n_leafs);
                    graph_copy->leafs[graph_copy->n_leafs++] = input_cpy;
                }
            }
        }
    }

    // add leafs from the original graph
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        sched->leaf_backend_ids[graph_copy->n_leafs] = tensor_backend_id(leaf);
        assert(graph_copy->size > graph_copy->n_leafs);
        graph_copy->leafs[graph_copy->n_leafs++] = leaf;
    }
}